

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextBase.cpp
# Opt level: O3

bool Diligent::VerifyBindSparseResourceMemoryAttribs
               (IRenderDevice *pDevice,BindSparseResourceMemoryAttribs *Attribs)

{
  SparseBufferMemoryBindRange *Args_5;
  SparseBufferMemoryBindRange *pSVar1;
  Uint32 *Args_5_00;
  Uint32 *Args_5_01;
  Uint64 *Args_8;
  byte bVar2;
  SparseBufferMemoryBindInfo *pSVar3;
  IDeviceMemory *pIVar4;
  SparseTextureMemoryBindRange *pSVar5;
  SparseTextureMemoryBindRange *Args_5_02;
  TextureDesc *pTVar6;
  int iVar7;
  int iVar8;
  uint uVar9;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  ulong uVar10;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  undefined4 extraout_var_10;
  uint uVar11;
  Uint32 UVar12;
  BindSparseResourceMemoryAttribs *in_RCX;
  uint extraout_EDX;
  SparseTextureMemoryBindInfo *pSVar13;
  IFence *pIVar14;
  char *in_R8;
  char (*in_R9) [45];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar15;
  TextureDesc *pTVar16;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar17;
  Uint64 *pUVar18;
  char (*Args_9) [32];
  Box *Args_5_03;
  char (*Args_9_00) [86];
  char (*Args_5_04) [42];
  char (*pacVar19) [2];
  char (*Args_9_01) [84];
  char (*Args_5_05) [43];
  uint uVar20;
  uint uVar21;
  uint uVar22;
  string msg_21;
  string msg;
  Uint64 Capacity;
  BindSparseResourceMemoryAttribs *local_c8;
  TextureDesc *local_c0;
  Uint32 MipDepth;
  Uint32 MipHeight;
  Uint32 MipWidth;
  char (*local_a8) [41];
  char (*local_a0) [42];
  char (*local_98) [41];
  SparseTextureMemoryBindRange *local_90;
  char (*local_88) [42];
  char (*local_80) [49];
  int local_74;
  BindSparseResourceMemoryAttribs *local_70;
  char (*local_68) [39];
  long local_60;
  Uint32 *local_58;
  Uint32 *local_50;
  SparseTextureMemoryBindInfo *local_48;
  Uint32 *local_40;
  SparseTextureMemoryBindRange *local_38;
  
  iVar7 = (*(pDevice->super_IObject)._vptr_IObject[0x19])();
  pTVar16 = (TextureDesc *)&Attribs->NumBufferBinds;
  local_c8 = Attribs;
  if (Attribs->NumBufferBinds != 0) {
    if (Attribs->pBufferBinds == (SparseBufferMemoryBindInfo *)0x0) {
      in_R8 = ", but pBufferBinds is null";
      FormatString<char[41],char[19],unsigned_int,char[27]>
                (&msg,(Diligent *)"Bind sparse memory attribs are invalid: ",
                 (char (*) [41])"NumBufferBinds is ",(char (*) [19])pTVar16,
                 (uint *)", but pBufferBinds is null",(char (*) [27])in_R9);
      in_RCX = (BindSparseResourceMemoryAttribs *)0x471;
      DebugAssertionFailed
                (msg._M_dataplus._M_p,"VerifyBindSparseResourceMemoryAttribs",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
                 ,0x471);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)msg._M_dataplus._M_p != &msg.field_2) {
        operator_delete(msg._M_dataplus._M_p,
                        CONCAT44(msg.field_2._M_allocated_capacity._4_4_,
                                 msg.field_2._M_allocated_capacity._0_4_) + 1);
      }
    }
    if ((*(byte *)(CONCAT44(extraout_var,iVar7) + 0x1b0) & 2) == 0) {
      FormatString<char[41],char[91]>
                (&msg,(Diligent *)"Bind sparse memory attribs are invalid: ",
                 (char (*) [41])
                 "NumBufferBinds must be zero if SPARSE_RESOURCE_CAP_FLAG_BUFFER capability is not supported"
                 ,(char (*) [91])in_RCX);
      in_RCX = (BindSparseResourceMemoryAttribs *)0x472;
      DebugAssertionFailed
                (msg._M_dataplus._M_p,"VerifyBindSparseResourceMemoryAttribs",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
                 ,0x472);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)msg._M_dataplus._M_p != &msg.field_2) {
        operator_delete(msg._M_dataplus._M_p,
                        CONCAT44(msg.field_2._M_allocated_capacity._4_4_,
                                 msg.field_2._M_allocated_capacity._0_4_) + 1);
      }
    }
  }
  local_70 = (BindSparseResourceMemoryAttribs *)&local_c8->NumTextureBinds;
  if (local_c8->NumTextureBinds != 0) {
    if (local_c8->pTextureBinds == (SparseTextureMemoryBindInfo *)0x0) {
      in_R8 = ", but pTextureBinds is null";
      FormatString<char[41],char[20],unsigned_int,char[28]>
                (&msg,(Diligent *)"Bind sparse memory attribs are invalid: ",
                 (char (*) [41])"NumTextureBinds is ",(char (*) [20])local_70,
                 (uint *)", but pTextureBinds is null",(char (*) [28])in_R9);
      in_RCX = (BindSparseResourceMemoryAttribs *)0x476;
      DebugAssertionFailed
                (msg._M_dataplus._M_p,"VerifyBindSparseResourceMemoryAttribs",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
                 ,0x476);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)msg._M_dataplus._M_p != &msg.field_2) {
        operator_delete(msg._M_dataplus._M_p,
                        CONCAT44(msg.field_2._M_allocated_capacity._4_4_,
                                 msg.field_2._M_allocated_capacity._0_4_) + 1);
      }
    }
    if ((*(byte *)(CONCAT44(extraout_var,iVar7) + 0x1b0) & 4) == 0) {
      FormatString<char[41],char[96]>
                (&msg,(Diligent *)"Bind sparse memory attribs are invalid: ",
                 (char (*) [41])
                 "NumTextureBinds must be zero if SPARSE_RESOURCE_CAP_FLAG_TEXTURE_2D capability is not supported"
                 ,(char (*) [96])in_RCX);
      in_RCX = (BindSparseResourceMemoryAttribs *)0x477;
      DebugAssertionFailed
                (msg._M_dataplus._M_p,"VerifyBindSparseResourceMemoryAttribs",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
                 ,0x477);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)msg._M_dataplus._M_p != &msg.field_2) {
        operator_delete(msg._M_dataplus._M_p,
                        CONCAT44(msg.field_2._M_allocated_capacity._4_4_,
                                 msg.field_2._M_allocated_capacity._0_4_) + 1);
      }
    }
  }
  if (*(int *)&local_70->pBufferBinds == 0 && *(Uint32 *)pTVar16 == 0) {
    FormatString<char[41],char[59]>
              (&msg,(Diligent *)"Bind sparse memory attribs are invalid: ",
               (char (*) [41])"One of NumBufferBinds and NumTextureBinds must not be zero",
               (char (*) [59])in_RCX);
    in_RCX = (BindSparseResourceMemoryAttribs *)0x47a;
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"VerifyBindSparseResourceMemoryAttribs",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
               ,0x47a);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)msg._M_dataplus._M_p != &msg.field_2) {
      operator_delete(msg._M_dataplus._M_p,
                      CONCAT44(msg.field_2._M_allocated_capacity._4_4_,
                               msg.field_2._M_allocated_capacity._0_4_) + 1);
    }
  }
  iVar7 = (*(pDevice->super_IObject)._vptr_IObject[0x18])(pDevice);
  local_74 = *(int *)CONCAT44(extraout_var_00,iVar7);
  uVar20 = 0;
  pTVar6 = pTVar16;
  if (*(Uint32 *)pTVar16 != 0) {
    do {
      local_c0 = pTVar6;
      pSVar3 = local_c8->pBufferBinds;
      in_RCX = local_c8;
      uVar21 = uVar20;
      if (pSVar3[uVar20].pBuffer == (IBuffer *)0x0) {
        in_R8 = "].pBuffer must not be null";
        FormatString<char[41],char[14],unsigned_int,char[27]>
                  (&msg,(Diligent *)"Bind sparse memory attribs are invalid: ",
                   (char (*) [41])"pBufferBinds[",(char (*) [14])&stack0xfffffffffffffed8,
                   (uint *)"].pBuffer must not be null",(char (*) [27])in_R9);
        in_RCX = (BindSparseResourceMemoryAttribs *)0x482;
        DebugAssertionFailed
                  (msg._M_dataplus._M_p,"VerifyBindSparseResourceMemoryAttribs",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
                   ,0x482);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)msg._M_dataplus._M_p != &msg.field_2) {
          operator_delete(msg._M_dataplus._M_p,
                          CONCAT44(msg.field_2._M_allocated_capacity._4_4_,
                                   msg.field_2._M_allocated_capacity._0_4_) + 1);
        }
      }
      pSVar3 = pSVar3 + uVar20;
      if (pSVar3->NumRanges == 0) {
        in_R8 = "].NumRanges must not be zero";
        FormatString<char[41],char[14],unsigned_int,char[29]>
                  (&msg,(Diligent *)"Bind sparse memory attribs are invalid: ",
                   (char (*) [41])"pBufferBinds[",(char (*) [14])&stack0xfffffffffffffed8,
                   (uint *)"].NumRanges must not be zero",(char (*) [29])in_R9);
        in_RCX = (BindSparseResourceMemoryAttribs *)0x483;
        DebugAssertionFailed
                  (msg._M_dataplus._M_p,"VerifyBindSparseResourceMemoryAttribs",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
                   ,0x483);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)msg._M_dataplus._M_p != &msg.field_2) {
          operator_delete(msg._M_dataplus._M_p,
                          CONCAT44(msg.field_2._M_allocated_capacity._4_4_,
                                   msg.field_2._M_allocated_capacity._0_4_) + 1);
        }
      }
      if (pSVar3->pRanges == (SparseBufferMemoryBindRange *)0x0) {
        in_R8 = "].pRanges must not be null";
        FormatString<char[41],char[14],unsigned_int,char[27]>
                  (&msg,(Diligent *)"Bind sparse memory attribs are invalid: ",
                   (char (*) [41])"pBufferBinds[",(char (*) [14])&stack0xfffffffffffffed8,
                   (uint *)"].pRanges must not be null",(char (*) [27])in_R9);
        in_RCX = (BindSparseResourceMemoryAttribs *)0x484;
        DebugAssertionFailed
                  (msg._M_dataplus._M_p,"VerifyBindSparseResourceMemoryAttribs",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
                   ,0x484);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)msg._M_dataplus._M_p != &msg.field_2) {
          operator_delete(msg._M_dataplus._M_p,
                          CONCAT44(msg.field_2._M_allocated_capacity._4_4_,
                                   msg.field_2._M_allocated_capacity._0_4_) + 1);
        }
      }
      if (pSVar3->pBuffer != (IBuffer *)0x0) {
        iVar7 = (*(pSVar3->pBuffer->super_IDeviceObject).super_IObject._vptr_IObject[4])();
        if (*(char *)(CONCAT44(extraout_var_01,iVar7) + 0x14) != '\x05') {
          in_R8 = "].pBuffer must be created with USAGE_SPARSE";
          FormatString<char[41],char[14],unsigned_int,char[44]>
                    (&msg,(Diligent *)"Bind sparse memory attribs are invalid: ",
                     (char (*) [41])"pBufferBinds[",(char (*) [14])&stack0xfffffffffffffed8,
                     (uint *)"].pBuffer must be created with USAGE_SPARSE",(char (*) [44])in_R9);
          in_RCX = (BindSparseResourceMemoryAttribs *)0x48a;
          DebugAssertionFailed
                    (msg._M_dataplus._M_p,"VerifyBindSparseResourceMemoryAttribs",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
                     ,0x48a);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)msg._M_dataplus._M_p != &msg.field_2) {
            operator_delete(msg._M_dataplus._M_p,
                            CONCAT44(msg.field_2._M_allocated_capacity._4_4_,
                                     msg.field_2._M_allocated_capacity._0_4_) + 1);
          }
        }
        if (pSVar3->pRanges != (SparseBufferMemoryBindRange *)0x0) {
          Args_9_00 = (char (*) [86])0x67a9c6;
          iVar8 = (*(pSVar3->pBuffer->super_IDeviceObject).super_IObject._vptr_IObject[0x10])();
          msg_21._M_dataplus._M_p = (pointer)CONCAT44(extraout_var_02,iVar8);
          uVar20 = 0;
          pTVar16 = local_c0;
          if (pSVar3->NumRanges != 0) {
            Args_9 = (char (*) [32])(CONCAT44(extraout_var_01,iVar7) + 8);
            msg_21._M_string_length._0_4_ = extraout_EDX;
            do {
              paVar15 = &msg.field_2;
              Args_5 = pSVar3->pRanges + uVar20;
              pSVar1 = pSVar3->pRanges + uVar20;
              pUVar18 = &pSVar1->MemorySize;
              uVar10 = pSVar1->BufferOffset;
              if (*(ulong *)*Args_9 < *pUVar18 + uVar10) {
                in_R8 = "].pRanges[";
                in_R9 = (char (*) [45])&stack0xfffffffffffffedc;
                FormatString<char[41],char[14],unsigned_int,char[11],unsigned_int,char[33],unsigned_long,char[11],unsigned_long,char[32],unsigned_long,char[2]>
                          (&msg,(Diligent *)"Bind sparse memory attribs are invalid: ",
                           (char (*) [41])"pBufferBinds[",(char (*) [14])&stack0xfffffffffffffed8,
                           (uint *)"].pRanges[",(char (*) [11])in_R9,
                           (uint *)"] specifies a range with offset ",(char (*) [33])Args_5,
                           (unsigned_long *)" and size ",(char (*) [11])pUVar18,
                           (unsigned_long *)" that exceeds the buffer size (",Args_9,
                           (unsigned_long *)0x920060,(char (*) [2])Args_9_00);
                Args_9_00 = (char (*) [86])0x67aa86;
                DebugAssertionFailed
                          (msg._M_dataplus._M_p,"VerifyBindSparseResourceMemoryAttribs",
                           "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
                           ,0x495);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)msg._M_dataplus._M_p != paVar15) {
                  Args_9_00 = (char (*) [86])0x67aa9d;
                  operator_delete(msg._M_dataplus._M_p,
                                  CONCAT44(msg.field_2._M_allocated_capacity._4_4_,
                                           msg.field_2._M_allocated_capacity._0_4_) + 1);
                }
                uVar10 = Args_5->BufferOffset;
              }
              if (uVar10 % (ulong)(uint)msg_21._M_string_length != 0) {
                in_R8 = "].pRanges[";
                in_R9 = (char (*) [45])&stack0xfffffffffffffedc;
                FormatString<char[41],char[14],unsigned_int,char[11],unsigned_int,char[17],unsigned_long,char[48],unsigned_int,char[2]>
                          (&msg,(Diligent *)"Bind sparse memory attribs are invalid: ",
                           (char (*) [41])"pBufferBinds[",(char (*) [14])&stack0xfffffffffffffed8,
                           (uint *)"].pRanges[",(char (*) [11])in_R9,(uint *)"].BufferOffset (",
                           (char (*) [17])Args_5,
                           (unsigned_long *)") must be a multiple of the buffer block size (",
                           (char (*) [48])&msg_21._M_string_length,(uint *)0x920060,
                           (char (*) [2])Args_9_00);
                Args_9_00 = (char (*) [86])0x67ab1c;
                DebugAssertionFailed
                          (msg._M_dataplus._M_p,"VerifyBindSparseResourceMemoryAttribs",
                           "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
                           ,0x498);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)msg._M_dataplus._M_p != paVar15) {
                  Args_9_00 = (char (*) [86])0x67ab33;
                  operator_delete(msg._M_dataplus._M_p,
                                  CONCAT44(msg.field_2._M_allocated_capacity._4_4_,
                                           msg.field_2._M_allocated_capacity._0_4_) + 1);
                }
              }
              uVar10 = *pUVar18;
              if (uVar10 == 0) {
                in_R8 = "].pRanges[";
                in_R9 = (char (*) [45])&stack0xfffffffffffffedc;
                FormatString<char[41],char[14],unsigned_int,char[11],unsigned_int,char[30]>
                          (&msg,(Diligent *)"Bind sparse memory attribs are invalid: ",
                           (char (*) [41])"pBufferBinds[",(char (*) [14])&stack0xfffffffffffffed8,
                           (uint *)"].pRanges[",(char (*) [11])in_R9,
                           (uint *)"].MemorySize must not be zero",(char (*) [30])Args_9_00);
                Args_9_00 = (char (*) [86])0x67ab8e;
                DebugAssertionFailed
                          (msg._M_dataplus._M_p,"VerifyBindSparseResourceMemoryAttribs",
                           "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
                           ,0x49b);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)msg._M_dataplus._M_p != paVar15) {
                  Args_9_00 = (char (*) [86])0x67aba5;
                  operator_delete(msg._M_dataplus._M_p,
                                  CONCAT44(msg.field_2._M_allocated_capacity._4_4_,
                                           msg.field_2._M_allocated_capacity._0_4_) + 1);
                }
                uVar10 = *pUVar18;
              }
              in_RCX = (BindSparseResourceMemoryAttribs *)(ulong)(uint)msg_21._M_string_length;
              if (uVar10 % (ulong)in_RCX != 0) {
                in_R8 = "].pRanges[";
                in_R9 = (char (*) [45])&stack0xfffffffffffffedc;
                FormatString<char[41],char[14],unsigned_int,char[11],unsigned_int,char[59],unsigned_int,char[2]>
                          (&msg,(Diligent *)"Bind sparse memory attribs are invalid: ",
                           (char (*) [41])"pBufferBinds[",(char (*) [14])&stack0xfffffffffffffed8,
                           (uint *)"].pRanges[",(char (*) [11])in_R9,
                           (uint *)"].MemorySize must be a multiple of the buffer block size (",
                           (char (*) [59])&msg_21._M_string_length,(uint *)0x920060,
                           (char (*) [2])Args_9_00);
                in_RCX = (BindSparseResourceMemoryAttribs *)0x49d;
                Args_9_00 = (char (*) [86])0x67ac17;
                DebugAssertionFailed
                          (msg._M_dataplus._M_p,"VerifyBindSparseResourceMemoryAttribs",
                           "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
                           ,0x49d);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)msg._M_dataplus._M_p != paVar15) {
                  Args_9_00 = (char (*) [86])0x67ac2e;
                  operator_delete(msg._M_dataplus._M_p,
                                  CONCAT44(msg.field_2._M_allocated_capacity._4_4_,
                                           msg.field_2._M_allocated_capacity._0_4_) + 1);
                }
              }
              pIVar4 = Args_5->pMemory;
              if (pIVar4 == (IDeviceMemory *)0x0) {
                if (Args_5->MemoryOffset != 0) {
                  in_R8 = "].pRanges[";
                  in_R9 = (char (*) [45])&stack0xfffffffffffffedc;
                  FormatString<char[41],char[14],unsigned_int,char[11],unsigned_int,char[52]>
                            (&msg,(Diligent *)"Bind sparse memory attribs are invalid: ",
                             (char (*) [41])"pBufferBinds[",(char (*) [14])&stack0xfffffffffffffed8,
                             (uint *)"].pRanges[",(char (*) [11])in_R9,
                             (uint *)"]: if pMemory is null, but MemoryOffset is not zero",
                             (char (*) [52])Args_9_00);
                  in_RCX = (BindSparseResourceMemoryAttribs *)0x4b4;
                  Args_9_00 = (char (*) [86])0x67ae7f;
                  DebugAssertionFailed
                            (msg._M_dataplus._M_p,"VerifyBindSparseResourceMemoryAttribs",
                             "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
                             ,0x4b4);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)msg._M_dataplus._M_p != paVar15) {
                    Args_9_00 = (char (*) [86])0x67ae96;
                    operator_delete(msg._M_dataplus._M_p,
                                    CONCAT44(msg.field_2._M_allocated_capacity._4_4_,
                                             msg.field_2._M_allocated_capacity._0_4_) + 1);
                  }
                }
              }
              else {
                Args_5_04 = (char (*) [42])0x67ac44;
                iVar7 = (*(pIVar4->super_IDeviceObject).super_IObject._vptr_IObject[10])
                                  (pIVar4,pSVar3->pBuffer);
                if ((char)iVar7 == '\0') {
                  in_R8 = "].pRanges[";
                  in_R9 = (char (*) [45])&stack0xfffffffffffffedc;
                  FormatString<char[41],char[14],unsigned_int,char[11],unsigned_int,char[42]>
                            (&msg,(Diligent *)"Bind sparse memory attribs are invalid: ",
                             (char (*) [41])"pBufferBinds[",(char (*) [14])&stack0xfffffffffffffed8,
                             (uint *)"].pRanges[",(char (*) [11])in_R9,
                             (uint *)"].pMemory must be compatible with pBuffer",Args_5_04);
                  DebugAssertionFailed
                            (msg._M_dataplus._M_p,"VerifyBindSparseResourceMemoryAttribs",
                             "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
                             ,0x4a2);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)msg._M_dataplus._M_p != paVar15) {
                    operator_delete(msg._M_dataplus._M_p,
                                    CONCAT44(msg.field_2._M_allocated_capacity._4_4_,
                                             msg.field_2._M_allocated_capacity._0_4_) + 1);
                  }
                }
                pacVar19 = (char (*) [2])0x67acbb;
                iVar7 = (*(Args_5->pMemory->super_IDeviceObject).super_IObject._vptr_IObject[9])();
                Capacity = CONCAT44(extraout_var_03,iVar7);
                if (Capacity < Args_5->MemorySize + Args_5->MemoryOffset) {
                  in_R8 = "].pRanges[";
                  in_R9 = (char (*) [45])&stack0xfffffffffffffedc;
                  FormatString<char[41],char[14],unsigned_int,char[11],unsigned_int,char[33],unsigned_long,char[11],unsigned_long,char[39],unsigned_long,char[2]>
                            (&msg,(Diligent *)"Bind sparse memory attribs are invalid: ",
                             (char (*) [41])"pBufferBinds[",(char (*) [14])&stack0xfffffffffffffed8,
                             (uint *)"].pRanges[",(char (*) [11])in_R9,
                             (uint *)"] specifies a range with offset ",
                             (char (*) [33])&Args_5->MemoryOffset,(unsigned_long *)" and size ",
                             (char (*) [11])pUVar18,
                             (unsigned_long *)" that exceeds the device memory size (",
                             (char (*) [39])&Capacity,(unsigned_long *)0x920060,pacVar19);
                  DebugAssertionFailed
                            (msg._M_dataplus._M_p,"VerifyBindSparseResourceMemoryAttribs",
                             "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
                             ,0x4a7);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)msg._M_dataplus._M_p != &msg.field_2) {
                    operator_delete(msg._M_dataplus._M_p,
                                    CONCAT44(msg.field_2._M_allocated_capacity._4_4_,
                                             msg.field_2._M_allocated_capacity._0_4_) + 1);
                  }
                }
                Args_9_00 = (char (*) [86])0x67ad6f;
                iVar7 = (*(Args_5->pMemory->super_IDeviceObject).super_IObject._vptr_IObject[4])();
                in_RCX = *(BindSparseResourceMemoryAttribs **)
                          (CONCAT44(extraout_var_04,iVar7) + 0x10);
                if (in_RCX < (BindSparseResourceMemoryAttribs *)
                             (Args_5->MemoryOffset % (ulong)in_RCX + Args_5->MemorySize)) {
                  in_R8 = "].pRanges[";
                  in_R9 = (char (*) [45])&stack0xfffffffffffffedc;
                  FormatString<char[41],char[14],unsigned_int,char[11],unsigned_int,char[33],unsigned_long,char[11],unsigned_long,char[86]>
                            (&msg,(Diligent *)"Bind sparse memory attribs are invalid: ",
                             (char (*) [41])"pBufferBinds[",(char (*) [14])&stack0xfffffffffffffed8,
                             (uint *)"].pRanges[",(char (*) [11])in_R9,
                             (uint *)"] specifies a range with offset ",
                             (char (*) [33])&Args_5->MemoryOffset,(unsigned_long *)" and size ",
                             (char (*) [11])pUVar18,
                             (unsigned_long *)
                             " that does not fit into a single page. in Direct3D12 and Vulkan this will be an error"
                             ,Args_9_00);
                  in_RCX = (BindSparseResourceMemoryAttribs *)0x4af;
                  Args_9_00 = (char (*) [86])0x67adef;
                  DebugAssertionFailed
                            (msg._M_dataplus._M_p,"VerifyBindSparseResourceMemoryAttribs",
                             "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
                             ,0x4af);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)msg._M_dataplus._M_p != &msg.field_2) {
                    Args_9_00 = (char (*) [86])0x67ae0b;
                    operator_delete(msg._M_dataplus._M_p,
                                    CONCAT44(msg.field_2._M_allocated_capacity._4_4_,
                                             msg.field_2._M_allocated_capacity._0_4_) + 1);
                  }
                }
              }
              uVar20 = uVar20 + 1;
              pTVar16 = local_c0;
            } while (uVar20 < pSVar3->NumRanges);
          }
        }
      }
      uVar20 = uVar21 + 1;
      pTVar6 = local_c0;
    } while (uVar20 < *(uint *)&(pTVar16->super_DeviceObjectAttribs).Name);
  }
  uVar20 = 0;
  if (*(int *)&local_70->pBufferBinds != 0) {
    paVar15 = &msg_21.field_2;
    do {
      paVar17 = &msg.field_2;
      pSVar13 = local_c8->pTextureBinds;
      uVar21 = uVar20;
      if (pSVar13[uVar20].pTexture == (ITexture *)0x0) {
        in_R8 = "].pTexture must not be null";
        FormatString<char[41],char[15],unsigned_int,char[28]>
                  (&msg,(Diligent *)"Bind sparse memory attribs are invalid: ",
                   (char (*) [41])"pTextureBinds[",(char (*) [15])&stack0xfffffffffffffed8,
                   (uint *)"].pTexture must not be null",(char (*) [28])in_R9);
        DebugAssertionFailed
                  (msg._M_dataplus._M_p,"VerifyBindSparseResourceMemoryAttribs",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
                   ,0x4bc);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)msg._M_dataplus._M_p != paVar17) {
          operator_delete(msg._M_dataplus._M_p,
                          CONCAT44(msg.field_2._M_allocated_capacity._4_4_,
                                   msg.field_2._M_allocated_capacity._0_4_) + 1);
        }
      }
      pSVar13 = pSVar13 + uVar20;
      if (pSVar13->NumRanges == 0) {
        in_R8 = "].NumRanges must not be zero";
        FormatString<char[41],char[15],unsigned_int,char[29]>
                  (&msg,(Diligent *)"Bind sparse memory attribs are invalid: ",
                   (char (*) [41])"pTextureBinds[",(char (*) [15])&stack0xfffffffffffffed8,
                   (uint *)"].NumRanges must not be zero",(char (*) [29])in_R9);
        DebugAssertionFailed
                  (msg._M_dataplus._M_p,"VerifyBindSparseResourceMemoryAttribs",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
                   ,0x4bd);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)msg._M_dataplus._M_p != paVar17) {
          operator_delete(msg._M_dataplus._M_p,
                          CONCAT44(msg.field_2._M_allocated_capacity._4_4_,
                                   msg.field_2._M_allocated_capacity._0_4_) + 1);
        }
      }
      if (pSVar13->pRanges == (SparseTextureMemoryBindRange *)0x0) {
        in_R8 = "].pRanges must not be null";
        FormatString<char[41],char[15],unsigned_int,char[27]>
                  (&msg,(Diligent *)"Bind sparse memory attribs are invalid: ",
                   (char (*) [41])"pTextureBinds[",(char (*) [15])&stack0xfffffffffffffed8,
                   (uint *)"].pRanges must not be null",(char (*) [27])in_R9);
        DebugAssertionFailed
                  (msg._M_dataplus._M_p,"VerifyBindSparseResourceMemoryAttribs",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
                   ,0x4be);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)msg._M_dataplus._M_p != paVar17) {
          operator_delete(msg._M_dataplus._M_p,
                          CONCAT44(msg.field_2._M_allocated_capacity._4_4_,
                                   msg.field_2._M_allocated_capacity._0_4_) + 1);
        }
      }
      if (pSVar13->pTexture != (ITexture *)0x0) {
        iVar7 = (*(pSVar13->pTexture->super_IDeviceObject).super_IObject._vptr_IObject[4])();
        local_c0 = (TextureDesc *)CONCAT44(extraout_var_05,iVar7);
        if (local_c0->Usage != USAGE_SPARSE) {
          in_R8 = "].pTexture must be created with USAGE_SPARSE";
          FormatString<char[41],char[15],unsigned_int,char[45]>
                    (&msg,(Diligent *)"Bind sparse memory attribs are invalid: ",
                     (char (*) [41])"pTextureBinds[",(char (*) [15])&stack0xfffffffffffffed8,
                     (uint *)"].pTexture must be created with USAGE_SPARSE",in_R9);
          DebugAssertionFailed
                    (msg._M_dataplus._M_p,"VerifyBindSparseResourceMemoryAttribs",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
                     ,0x4c4);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)msg._M_dataplus._M_p != paVar17) {
            operator_delete(msg._M_dataplus._M_p,
                            CONCAT44(msg.field_2._M_allocated_capacity._4_4_,
                                     msg.field_2._M_allocated_capacity._0_4_) + 1);
          }
        }
        if (pSVar13->pRanges != (SparseTextureMemoryBindRange *)0x0) {
          iVar7 = (*(pSVar13->pTexture->super_IDeviceObject).super_IObject._vptr_IObject[0xd])();
          local_60 = CONCAT44(extraout_var_06,iVar7);
          uVar20 = 0;
          if (pSVar13->NumRanges != 0) {
            local_40 = &local_c0->MipLevels;
            local_88 = (char (*) [42])(local_60 + 0x20);
            local_68 = (char (*) [39])(local_60 + 0x18);
            local_80 = (char (*) [49])(local_60 + 0x30);
            local_98 = (char (*) [41])(local_60 + 0x24);
            local_a0 = (char (*) [42])(local_60 + 0x28);
            local_a8 = (char (*) [41])(local_60 + 0x2c);
            local_48 = pSVar13;
            do {
              pTVar16 = local_c0;
              pSVar5 = pSVar13->pRanges;
              local_38 = pSVar5 + uVar20;
              Args_9_01 = (char (*) [84])0x67b12f;
              uVar22 = uVar20;
              GetMipLevelProperties((MipLevelProperties *)&msg,local_c0,pSVar5[uVar20].MipLevel);
              Args_5_02 = local_38;
              MipWidth = (Uint32)msg._M_string_length;
              MipHeight = msg._M_string_length._4_4_;
              MipDepth = msg.field_2._M_allocated_capacity._0_4_;
              uVar9 = pSVar5[uVar20].MipLevel;
              local_90 = pSVar5;
              if (pTVar16->MipLevels <= uVar9) {
                in_R8 = "].pRanges[";
                in_R9 = (char (*) [45])&stack0xfffffffffffffedc;
                FormatString<char[41],char[15],unsigned_int,char[11],unsigned_int,char[13],unsigned_int,char[42],unsigned_int,char[3]>
                          (&msg_21,(Diligent *)"Bind sparse memory attribs are invalid: ",
                           (char (*) [41])"pTextureBinds[",(char (*) [15])&stack0xfffffffffffffed8,
                           (uint *)"].pRanges[",(char (*) [11])in_R9,(uint *)"].MipLevel (",
                           (char (*) [13])local_38,
                           (uint *)") must be less than the mip level count (",
                           (char (*) [42])local_40,(uint *)0x91fe20,(char (*) [3])Args_9_01);
                Args_9_01 = (char (*) [84])0x67b1d5;
                DebugAssertionFailed
                          (msg_21._M_dataplus._M_p,"VerifyBindSparseResourceMemoryAttribs",
                           "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
                           ,0x4d5);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)msg_21._M_dataplus._M_p != paVar15) {
                  Args_9_01 = (char (*) [84])0x67b1ec;
                  operator_delete(msg_21._M_dataplus._M_p,msg_21.field_2._M_allocated_capacity + 1);
                }
                uVar9 = Args_5_02->MipLevel;
              }
              uVar11 = *(uint *)*local_88;
              if (uVar11 < uVar9) {
                in_R8 = "].pRanges[";
                in_R9 = (char (*) [45])&stack0xfffffffffffffedc;
                FormatString<char[41],char[15],unsigned_int,char[11],unsigned_int,char[13],unsigned_int,char[42],unsigned_int,char[2]>
                          (&msg_21,(Diligent *)"Bind sparse memory attribs are invalid: ",
                           (char (*) [41])"pTextureBinds[",(char (*) [15])&stack0xfffffffffffffed8,
                           (uint *)"].pRanges[",(char (*) [11])in_R9,(uint *)"].MipLevel (",
                           (char (*) [13])Args_5_02,
                           (uint *)") must not exceed the first mip in tail (",local_88,
                           (uint *)0x920060,(char (*) [2])Args_9_01);
                Args_9_01 = (char (*) [84])0x67b269;
                DebugAssertionFailed
                          (msg_21._M_dataplus._M_p,"VerifyBindSparseResourceMemoryAttribs",
                           "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
                           ,0x4d8);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)msg_21._M_dataplus._M_p != paVar15) {
                  Args_9_01 = (char (*) [84])0x67b280;
                  operator_delete(msg_21._M_dataplus._M_p,msg_21.field_2._M_allocated_capacity + 1);
                }
                uVar9 = Args_5_02->MipLevel;
                uVar11 = *(uint *)*local_88;
              }
              Args_5_03 = &local_90[uVar20].Region;
              if (uVar9 < uVar11) {
                if (Args_5_02->OffsetInMipTail != 0) {
                  in_R8 = "].pRanges[";
                  in_R9 = (char (*) [45])&stack0xfffffffffffffedc;
                  FormatString<char[41],char[15],unsigned_int,char[11],unsigned_int,char[69]>
                            (&msg_21,(Diligent *)"Bind sparse memory attribs are invalid: ",
                             (char (*) [41])"pTextureBinds[",(char (*) [15])&stack0xfffffffffffffed8
                             ,(uint *)"].pRanges[",(char (*) [11])in_R9,
                             (uint *)
                             "].OffsetInMipTail must be zero when Range.MipLevel is not a tail mip",
                             (char (*) [69])Args_9_01);
                  Args_9_01 = (char (*) [84])0x67b2fb;
                  DebugAssertionFailed
                            (msg_21._M_dataplus._M_p,"VerifyBindSparseResourceMemoryAttribs",
                             "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
                             ,0x4dd);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)msg_21._M_dataplus._M_p != paVar15) {
                    Args_9_01 = (char (*) [84])0x67b312;
                    operator_delete(msg_21._M_dataplus._M_p,msg_21.field_2._M_allocated_capacity + 1
                                   );
                  }
                }
                local_90 = (SparseTextureMemoryBindRange *)&(Args_5_02->Region).MaxX;
                uVar20 = (Args_5_02->Region).MaxX;
                if (((uVar20 <= (Args_5_02->Region).MinX) ||
                    ((Args_5_02->Region).MaxY <= (Args_5_02->Region).MinY)) ||
                   ((Args_5_02->Region).MaxZ <= (Args_5_02->Region).MinZ)) {
                  in_R8 = "].pRanges[";
                  in_R9 = (char (*) [45])&stack0xfffffffffffffedc;
                  FormatString<char[41],char[15],unsigned_int,char[11],unsigned_int,char[23]>
                            (&msg_21,(Diligent *)"Bind sparse memory attribs are invalid: ",
                             (char (*) [41])"pTextureBinds[",(char (*) [15])&stack0xfffffffffffffed8
                             ,(uint *)"].pRanges[",(char (*) [11])in_R9,
                             (uint *)"].Region must be valid",(char (*) [23])Args_9_01);
                  Args_9_01 = (char (*) [84])0x67b391;
                  DebugAssertionFailed
                            (msg_21._M_dataplus._M_p,"VerifyBindSparseResourceMemoryAttribs",
                             "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
                             ,0x4df);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)msg_21._M_dataplus._M_p != paVar15) {
                    Args_9_01 = (char (*) [84])0x67b3a8;
                    operator_delete(msg_21._M_dataplus._M_p,msg_21.field_2._M_allocated_capacity + 1
                                   );
                  }
                  uVar20 = local_90->MipLevel;
                }
                UVar12 = MipWidth;
                if (MipWidth < uVar20) {
                  uVar9 = *(uint *)*local_98;
                  Capacity = CONCAT44(Capacity._4_4_,uVar9);
                  if ((uVar9 ^ uVar9 - 1) <= uVar9 - 1) {
                    FormatString<char[12],unsigned_int,char[23]>
                              (&msg_21,(Diligent *)"Alignment (",(char (*) [12])&Capacity,
                               (uint *)") must be a power of 2",(char (*) [23])in_R8);
                    Args_9_01 = (char (*) [84])0x67b416;
                    DebugAssertionFailed
                              (msg_21._M_dataplus._M_p,"AlignUp",
                               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsAccessories/interface/../../../Common/interface/Align.hpp"
                               ,0x34);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)msg_21._M_dataplus._M_p != paVar15) {
                      Args_9_01 = (char (*) [84])0x67b42d;
                      operator_delete(msg_21._M_dataplus._M_p,
                                      msg_21.field_2._M_allocated_capacity + 1);
                    }
                    uVar9 = (uint)Capacity;
                  }
                  if (uVar20 != (-uVar9 & (UVar12 + uVar9) - 1)) {
                    in_R8 = "].pRanges[";
                    in_R9 = (char (*) [45])&stack0xfffffffffffffedc;
                    FormatString<char[41],char[15],unsigned_int,char[11],unsigned_int,char[16],unsigned_int,char[40],unsigned_int,char[2]>
                              (&msg_21,(Diligent *)"Bind sparse memory attribs are invalid: ",
                               (char (*) [41])"pTextureBinds[",
                               (char (*) [15])&stack0xfffffffffffffed8,(uint *)"].pRanges[",
                               (char (*) [11])in_R9,(uint *)"].Region.MaxX (",
                               (char (*) [16])local_90,
                               (uint *)") must not exceed the mip level width (",
                               (char (*) [40])&MipWidth,(uint *)0x920060,(char (*) [2])Args_9_01);
                    Args_9_01 = (char (*) [84])0x67b4b5;
                    DebugAssertionFailed
                              (msg_21._M_dataplus._M_p,"VerifyBindSparseResourceMemoryAttribs",
                               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
                               ,0x4e1);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)msg_21._M_dataplus._M_p != paVar15) {
                      Args_9_01 = (char (*) [84])0x67b4cc;
                      operator_delete(msg_21._M_dataplus._M_p,
                                      msg_21.field_2._M_allocated_capacity + 1);
                    }
                  }
                }
                UVar12 = MipHeight;
                local_50 = &(Args_5_02->Region).MaxY;
                uVar20 = (Args_5_02->Region).MaxY;
                if (MipHeight < uVar20) {
                  uVar9 = *(uint *)*local_a0;
                  Capacity = CONCAT44(Capacity._4_4_,uVar9);
                  if ((uVar9 ^ uVar9 - 1) <= uVar9 - 1) {
                    FormatString<char[12],unsigned_int,char[23]>
                              (&msg_21,(Diligent *)"Alignment (",(char (*) [12])&Capacity,
                               (uint *)") must be a power of 2",(char (*) [23])in_R8);
                    Args_9_01 = (char (*) [84])0x67b53f;
                    DebugAssertionFailed
                              (msg_21._M_dataplus._M_p,"AlignUp",
                               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsAccessories/interface/../../../Common/interface/Align.hpp"
                               ,0x34);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)msg_21._M_dataplus._M_p != paVar15) {
                      Args_9_01 = (char (*) [84])0x67b556;
                      operator_delete(msg_21._M_dataplus._M_p,
                                      msg_21.field_2._M_allocated_capacity + 1);
                    }
                    uVar9 = (uint)Capacity;
                  }
                  if (uVar20 != (-uVar9 & (UVar12 + uVar9) - 1)) {
                    in_R8 = "].pRanges[";
                    in_R9 = (char (*) [45])&stack0xfffffffffffffedc;
                    FormatString<char[41],char[15],unsigned_int,char[11],unsigned_int,char[16],unsigned_int,char[41],unsigned_int,char[2]>
                              (&msg_21,(Diligent *)"Bind sparse memory attribs are invalid: ",
                               (char (*) [41])"pTextureBinds[",
                               (char (*) [15])&stack0xfffffffffffffed8,(uint *)"].pRanges[",
                               (char (*) [11])in_R9,(uint *)"].Region.MaxY (",
                               (char (*) [16])local_50,
                               (uint *)") must not exceed the mip level height (",
                               (char (*) [41])&MipHeight,(uint *)0x920060,(char (*) [2])Args_9_01);
                    Args_9_01 = (char (*) [84])0x67b5de;
                    DebugAssertionFailed
                              (msg_21._M_dataplus._M_p,"VerifyBindSparseResourceMemoryAttribs",
                               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
                               ,0x4e3);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)msg_21._M_dataplus._M_p != paVar15) {
                      Args_9_01 = (char (*) [84])0x67b5f5;
                      operator_delete(msg_21._M_dataplus._M_p,
                                      msg_21.field_2._M_allocated_capacity + 1);
                    }
                  }
                }
                UVar12 = MipDepth;
                local_58 = &(Args_5_02->Region).MaxZ;
                uVar20 = (Args_5_02->Region).MaxZ;
                if (MipDepth < uVar20) {
                  uVar9 = *(uint *)*local_a8;
                  Capacity = CONCAT44(Capacity._4_4_,uVar9);
                  if ((uVar9 ^ uVar9 - 1) <= uVar9 - 1) {
                    FormatString<char[12],unsigned_int,char[23]>
                              (&msg_21,(Diligent *)"Alignment (",(char (*) [12])&Capacity,
                               (uint *)") must be a power of 2",(char (*) [23])in_R8);
                    Args_9_01 = (char (*) [84])0x67b668;
                    DebugAssertionFailed
                              (msg_21._M_dataplus._M_p,"AlignUp",
                               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsAccessories/interface/../../../Common/interface/Align.hpp"
                               ,0x34);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)msg_21._M_dataplus._M_p != paVar15) {
                      Args_9_01 = (char (*) [84])0x67b67f;
                      operator_delete(msg_21._M_dataplus._M_p,
                                      msg_21.field_2._M_allocated_capacity + 1);
                    }
                    uVar9 = (uint)Capacity;
                  }
                  if (uVar20 != (-uVar9 & (UVar12 + uVar9) - 1)) {
                    in_R8 = "].pRanges[";
                    in_R9 = (char (*) [45])&stack0xfffffffffffffedc;
                    FormatString<char[41],char[15],unsigned_int,char[11],unsigned_int,char[16],unsigned_int,char[40],unsigned_int,char[2]>
                              (&msg_21,(Diligent *)"Bind sparse memory attribs are invalid: ",
                               (char (*) [41])"pTextureBinds[",
                               (char (*) [15])&stack0xfffffffffffffed8,(uint *)"].pRanges[",
                               (char (*) [11])in_R9,(uint *)"].Region.MaxZ (",
                               (char (*) [16])local_58,
                               (uint *)") must not exceed the mip level depth (",
                               (char (*) [40])&MipDepth,(uint *)0x920060,(char (*) [2])Args_9_01);
                    Args_9_01 = (char (*) [84])0x67b707;
                    DebugAssertionFailed
                              (msg_21._M_dataplus._M_p,"VerifyBindSparseResourceMemoryAttribs",
                               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
                               ,0x4e5);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)msg_21._M_dataplus._M_p != paVar15) {
                      Args_9_01 = (char (*) [84])0x67b71e;
                      operator_delete(msg_21._M_dataplus._M_p,
                                      msg_21.field_2._M_allocated_capacity + 1);
                    }
                  }
                }
                if (Args_5_03->MinX % *(uint *)*local_98 != 0) {
                  in_R8 = "].pRanges[";
                  in_R9 = (char (*) [45])&stack0xfffffffffffffedc;
                  FormatString<char[41],char[15],unsigned_int,char[11],unsigned_int,char[16],unsigned_int,char[41],unsigned_int,char[2]>
                            (&msg_21,(Diligent *)"Bind sparse memory attribs are invalid: ",
                             (char (*) [41])"pTextureBinds[",(char (*) [15])&stack0xfffffffffffffed8
                             ,(uint *)"].pRanges[",(char (*) [11])in_R9,(uint *)"].Region.MinX (",
                             (char (*) [16])Args_5_03,
                             (uint *)") must be a multiple of the tile width (",local_98,
                             (uint *)0x920060,(char (*) [2])Args_9_01);
                  Args_9_01 = (char (*) [84])0x67b7a3;
                  DebugAssertionFailed
                            (msg_21._M_dataplus._M_p,"VerifyBindSparseResourceMemoryAttribs",
                             "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
                             ,0x4e8);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)msg_21._M_dataplus._M_p != paVar15) {
                    Args_9_01 = (char (*) [84])0x67b7ba;
                    operator_delete(msg_21._M_dataplus._M_p,msg_21.field_2._M_allocated_capacity + 1
                                   );
                  }
                }
                Args_5_00 = &(Args_5_02->Region).MinY;
                if ((Args_5_02->Region).MinY % *(uint *)*local_a0 != 0) {
                  in_R8 = "].pRanges[";
                  in_R9 = (char (*) [45])&stack0xfffffffffffffedc;
                  FormatString<char[41],char[15],unsigned_int,char[11],unsigned_int,char[16],unsigned_int,char[42],unsigned_int,char[2]>
                            (&msg_21,(Diligent *)"Bind sparse memory attribs are invalid: ",
                             (char (*) [41])"pTextureBinds[",(char (*) [15])&stack0xfffffffffffffed8
                             ,(uint *)"].pRanges[",(char (*) [11])in_R9,(uint *)"].Region.MinY (",
                             (char (*) [16])Args_5_00,
                             (uint *)") must be a multiple of the tile height (",local_a0,
                             (uint *)0x920060,(char (*) [2])Args_9_01);
                  Args_9_01 = (char (*) [84])0x67b842;
                  DebugAssertionFailed
                            (msg_21._M_dataplus._M_p,"VerifyBindSparseResourceMemoryAttribs",
                             "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
                             ,0x4ea);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)msg_21._M_dataplus._M_p != paVar15) {
                    Args_9_01 = (char (*) [84])0x67b859;
                    operator_delete(msg_21._M_dataplus._M_p,msg_21.field_2._M_allocated_capacity + 1
                                   );
                  }
                }
                Args_5_01 = &(Args_5_02->Region).MinZ;
                if ((Args_5_02->Region).MinZ % *(uint *)*local_a8 != 0) {
                  in_R8 = "].pRanges[";
                  in_R9 = (char (*) [45])&stack0xfffffffffffffedc;
                  FormatString<char[41],char[15],unsigned_int,char[11],unsigned_int,char[16],unsigned_int,char[41],unsigned_int,char[2]>
                            (&msg_21,(Diligent *)"Bind sparse memory attribs are invalid: ",
                             (char (*) [41])"pTextureBinds[",(char (*) [15])&stack0xfffffffffffffed8
                             ,(uint *)"].pRanges[",(char (*) [11])in_R9,(uint *)"].Region.MinZ (",
                             (char (*) [16])Args_5_01,
                             (uint *)") must be a multiple of the tile depth (",local_a8,
                             (uint *)0x920060,(char (*) [2])Args_9_01);
                  Args_9_01 = (char (*) [84])0x67b8e2;
                  DebugAssertionFailed
                            (msg_21._M_dataplus._M_p,"VerifyBindSparseResourceMemoryAttribs",
                             "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
                             ,0x4ec);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)msg_21._M_dataplus._M_p != paVar15) {
                    Args_9_01 = (char (*) [84])0x67b8f9;
                    operator_delete(msg_21._M_dataplus._M_p,msg_21.field_2._M_allocated_capacity + 1
                                   );
                  }
                }
                uVar20 = local_90->MipLevel - Args_5_03->MinX;
                if ((uVar20 % *(uint *)*local_98 != 0) && (local_90->MipLevel != MipWidth)) {
                  Capacity = CONCAT44(Capacity._4_4_,uVar20);
                  in_R8 = "].pRanges[";
                  in_R9 = (char (*) [45])&stack0xfffffffffffffedc;
                  FormatString<char[41],char[15],unsigned_int,char[11],unsigned_int,char[17],unsigned_int,char[41],unsigned_int,char[2]>
                            (&msg_21,(Diligent *)"Bind sparse memory attribs are invalid: ",
                             (char (*) [41])"pTextureBinds[",(char (*) [15])&stack0xfffffffffffffed8
                             ,(uint *)"].pRanges[",(char (*) [11])in_R9,(uint *)"].Region width (",
                             (char (*) [17])&Capacity,
                             (uint *)") must be a multiple of the tile width (",local_98,
                             (uint *)0x920060,(char (*) [2])Args_9_01);
                  Args_9_01 = (char (*) [84])0x67b99b;
                  DebugAssertionFailed
                            (msg_21._M_dataplus._M_p,"VerifyBindSparseResourceMemoryAttribs",
                             "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
                             ,0x4ee);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)msg_21._M_dataplus._M_p != paVar15) {
                    Args_9_01 = (char (*) [84])0x67b9b2;
                    operator_delete(msg_21._M_dataplus._M_p,msg_21.field_2._M_allocated_capacity + 1
                                   );
                  }
                }
                uVar20 = *local_50 - *Args_5_00;
                if ((uVar20 % *(uint *)*local_a0 != 0) && (*local_50 != MipHeight)) {
                  Capacity = CONCAT44(Capacity._4_4_,uVar20);
                  in_R8 = "].pRanges[";
                  in_R9 = (char (*) [45])&stack0xfffffffffffffedc;
                  FormatString<char[41],char[15],unsigned_int,char[11],unsigned_int,char[18],unsigned_int,char[40],unsigned_int,char[2]>
                            (&msg_21,(Diligent *)"Bind sparse memory attribs are invalid: ",
                             (char (*) [41])"pTextureBinds[",(char (*) [15])&stack0xfffffffffffffed8
                             ,(uint *)"].pRanges[",(char (*) [11])in_R9,(uint *)"].Region height (",
                             (char (*) [18])&Capacity,
                             (uint *)") must be multiple of the tile height (",
                             (char (*) [40])local_a0,(uint *)0x920060,(char (*) [2])Args_9_01);
                  Args_9_01 = (char (*) [84])0x67ba53;
                  DebugAssertionFailed
                            (msg_21._M_dataplus._M_p,"VerifyBindSparseResourceMemoryAttribs",
                             "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
                             ,0x4f0);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)msg_21._M_dataplus._M_p != paVar15) {
                    Args_9_01 = (char (*) [84])0x67ba6a;
                    operator_delete(msg_21._M_dataplus._M_p,msg_21.field_2._M_allocated_capacity + 1
                                   );
                  }
                }
                uVar20 = *local_58 - *Args_5_01;
                if ((uVar20 % *(uint *)*local_a8 != 0) && (*local_58 != MipDepth)) {
                  Capacity = CONCAT44(Capacity._4_4_,uVar20);
                  in_R8 = "].pRanges[";
                  in_R9 = (char (*) [45])&stack0xfffffffffffffedc;
                  FormatString<char[41],char[15],unsigned_int,char[11],unsigned_int,char[17],unsigned_int,char[41],unsigned_int,char[2]>
                            (&msg_21,(Diligent *)"Bind sparse memory attribs are invalid: ",
                             (char (*) [41])"pTextureBinds[",(char (*) [15])&stack0xfffffffffffffed8
                             ,(uint *)"].pRanges[",(char (*) [11])in_R9,(uint *)"].Region depth (",
                             (char (*) [17])&Capacity,
                             (uint *)") must be a multiple of the tile depth (",local_a8,
                             (uint *)0x920060,(char (*) [2])Args_9_01);
                  Args_9_01 = (char (*) [84])0x67bb12;
                  DebugAssertionFailed
                            (msg_21._M_dataplus._M_p,"VerifyBindSparseResourceMemoryAttribs",
                             "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
                             ,0x4f2);
LAB_0067be1a:
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)msg_21._M_dataplus._M_p != paVar15) {
                    Args_9_01 = (char (*) [84])0x67be31;
                    operator_delete(msg_21._M_dataplus._M_p,msg_21.field_2._M_allocated_capacity + 1
                                   );
                  }
                }
              }
              else {
                if (((((Args_5_03->MinX != 0) || ((Args_5_02->Region).MaxX != 0)) ||
                     ((Args_5_02->Region).MinY != 0)) ||
                    (((Args_5_02->Region).MaxY != 0 || ((Args_5_02->Region).MinZ != 0)))) ||
                   ((Args_5_02->Region).MaxZ != 1)) {
                  in_R8 = "].pRanges[";
                  in_R9 = (char (*) [45])&stack0xfffffffffffffedc;
                  FormatString<char[41],char[15],unsigned_int,char[11],unsigned_int,char[59]>
                            (&msg_21,(Diligent *)"Bind sparse memory attribs are invalid: ",
                             (char (*) [41])"pTextureBinds[",(char (*) [15])&stack0xfffffffffffffed8
                             ,(uint *)"].pRanges[",(char (*) [11])in_R9,
                             (uint *)"].Region must be default when Range.MipLevel is a tail mip",
                             (char (*) [59])Args_9_01);
                  Args_9_01 = (char (*) [84])0x67bb93;
                  DebugAssertionFailed
                            (msg_21._M_dataplus._M_p,"VerifyBindSparseResourceMemoryAttribs",
                             "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
                             ,0x4f7);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)msg_21._M_dataplus._M_p != paVar15) {
                    Args_9_01 = (char (*) [84])0x67bbaa;
                    operator_delete(msg_21._M_dataplus._M_p,msg_21.field_2._M_allocated_capacity + 1
                                   );
                  }
                }
                pUVar18 = &Args_5_02->OffsetInMipTail;
                uVar10 = Args_5_02->OffsetInMipTail;
                Args_8 = &Args_5_02->MemorySize;
                if (*(ulong *)*local_68 < Args_5_02->MemorySize + uVar10) {
                  in_R8 = "].pRanges[";
                  in_R9 = (char (*) [45])&stack0xfffffffffffffedc;
                  FormatString<char[41],char[15],unsigned_int,char[11],unsigned_int,char[30],unsigned_long,char[19],unsigned_long,char[34],unsigned_long,char[2]>
                            (&msg_21,(Diligent *)"Bind sparse memory attribs are invalid: ",
                             (char (*) [41])"pTextureBinds[",(char (*) [15])&stack0xfffffffffffffed8
                             ,(uint *)"].pRanges[",(char (*) [11])in_R9,
                             (uint *)"] specifies OffsetInMipTail (",(char (*) [30])pUVar18,
                             (unsigned_long *)") and MemorySize (",(char (*) [19])Args_8,
                             (unsigned_long *)") that exceed the mip tail size (",
                             (char (*) [34])local_68,(unsigned_long *)0x920060,
                             (char (*) [2])Args_9_01);
                  Args_9_01 = (char (*) [84])0x67bc42;
                  DebugAssertionFailed
                            (msg_21._M_dataplus._M_p,"VerifyBindSparseResourceMemoryAttribs",
                             "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
                             ,0x4fa);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)msg_21._M_dataplus._M_p != paVar15) {
                    Args_9_01 = (char (*) [84])0x67bc59;
                    operator_delete(msg_21._M_dataplus._M_p,msg_21.field_2._M_allocated_capacity + 1
                                   );
                  }
                  uVar10 = *pUVar18;
                }
                if (uVar10 % (ulong)*(uint *)*local_80 != 0) {
                  in_R8 = "].pRanges[";
                  in_R9 = (char (*) [45])&stack0xfffffffffffffedc;
                  FormatString<char[41],char[15],unsigned_int,char[11],unsigned_int,char[20],unsigned_long,char[49],unsigned_int,char[2]>
                            (&msg_21,(Diligent *)"Bind sparse memory attribs are invalid: ",
                             (char (*) [41])"pTextureBinds[",(char (*) [15])&stack0xfffffffffffffed8
                             ,(uint *)"].pRanges[",(char (*) [11])in_R9,
                             (uint *)"].OffsetInMipTail (",(char (*) [20])pUVar18,
                             (unsigned_long *)") must be a multiple of the texture block size (",
                             local_80,(uint *)0x920060,(char (*) [2])Args_9_01);
                  Args_9_01 = (char (*) [84])0x67bcd6;
                  DebugAssertionFailed
                            (msg_21._M_dataplus._M_p,"VerifyBindSparseResourceMemoryAttribs",
                             "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
                             ,0x4fd);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)msg_21._M_dataplus._M_p != paVar15) {
                    Args_9_01 = (char (*) [84])0x67bced;
                    operator_delete(msg_21._M_dataplus._M_p,msg_21.field_2._M_allocated_capacity + 1
                                   );
                  }
                }
                if (((*(byte *)(local_60 + 0x34) & 1) != 0) && (Args_5_02->ArraySlice != 0)) {
                  in_R8 = "].pRanges[";
                  in_R9 = (char (*) [45])&stack0xfffffffffffffedc;
                  FormatString<char[41],char[15],unsigned_int,char[11],unsigned_int,char[15],unsigned_int,char[34]>
                            (&msg_21,(Diligent *)"Bind sparse memory attribs are invalid: ",
                             (char (*) [41])"pTextureBinds[",(char (*) [15])&stack0xfffffffffffffed8
                             ,(uint *)"].pRanges[",(char (*) [11])in_R9,(uint *)"].ArraySlice (",
                             (char (*) [15])&Args_5_02->ArraySlice,
                             (uint *)") must be 0 for a single mip tail",(char (*) [34])Args_9_01);
                  Args_9_01 = (char (*) [84])0x67bd60;
                  DebugAssertionFailed
                            (msg_21._M_dataplus._M_p,"VerifyBindSparseResourceMemoryAttribs",
                             "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
                             ,0x502);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)msg_21._M_dataplus._M_p != paVar15) {
                    Args_9_01 = (char (*) [84])0x67bd77;
                    operator_delete(msg_21._M_dataplus._M_p,msg_21.field_2._M_allocated_capacity + 1
                                   );
                  }
                }
                if ((local_74 == 6) &&
                   ((*pUVar18 != 0 || ((*Args_8 != 0 && (*Args_8 != *(Uint64 *)*local_68)))))) {
                  in_R8 = "].pRanges[";
                  in_R9 = (char (*) [45])&stack0xfffffffffffffedc;
                  FormatString<char[41],char[15],unsigned_int,char[11],unsigned_int,char[63],char[18],unsigned_long,char[32],unsigned_long,char[39],unsigned_long,char[10]>
                            (&msg_21,(Diligent *)"Bind sparse memory attribs are invalid: ",
                             (char (*) [41])"pTextureBinds[",(char (*) [15])&stack0xfffffffffffffed8
                             ,(uint *)"].pRanges[",(char (*) [11])in_R9,
                             (uint *)
                             "]: in Metal, mip tail must be bound in a single memory range: ",
                             (char (*) [63])0x9093dd,(char (*) [18])pUVar18,
                             (unsigned_long *)") must be zero and MemorySize (",
                             (char (*) [32])Args_8,
                             (unsigned_long *)") must be equal to the mip tail size (",local_68,
                             (unsigned_long *)") or zero",(char (*) [10])CONCAT44(uVar22,uVar21));
                  Args_9_01 = (char (*) [84])0x67be1a;
                  DebugAssertionFailed
                            (msg_21._M_dataplus._M_p,"VerifyBindSparseResourceMemoryAttribs",
                             "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
                             ,0x50a);
                  goto LAB_0067be1a;
                }
              }
              bVar2 = local_c0->Type;
              uVar20 = 1;
              if ((bVar2 < 9) && ((0x1a8U >> (bVar2 & 0x1f) & 1) != 0)) {
                uVar20 = (local_c0->field_3).ArraySize;
              }
              if (uVar20 <= Args_5_02->ArraySlice) {
                UVar12 = 1;
                if ((bVar2 < 9) && ((0x1a8U >> (bVar2 & 0x1f) & 1) != 0)) {
                  UVar12 = (local_c0->field_3).ArraySize;
                }
                Capacity = CONCAT44(Capacity._4_4_,UVar12);
                in_R8 = "].pRanges[";
                in_R9 = (char (*) [45])&stack0xfffffffffffffedc;
                FormatString<char[41],char[15],unsigned_int,char[11],unsigned_int,char[15],unsigned_int,char[37],unsigned_int,char[2]>
                          (&msg_21,(Diligent *)"Bind sparse memory attribs are invalid: ",
                           (char (*) [41])"pTextureBinds[",(char (*) [15])&stack0xfffffffffffffed8,
                           (uint *)"].pRanges[",(char (*) [11])in_R9,(uint *)"].ArraySlice (",
                           (char (*) [15])&Args_5_02->ArraySlice,
                           (uint *)") must be less than the array size (",(char (*) [37])&Capacity,
                           (uint *)0x920060,(char (*) [2])Args_9_01);
                Args_9_01 = (char (*) [84])0x67bef0;
                DebugAssertionFailed
                          (msg_21._M_dataplus._M_p,"VerifyBindSparseResourceMemoryAttribs",
                           "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
                           ,0x50f);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)msg_21._M_dataplus._M_p != paVar15) {
                  Args_9_01 = (char (*) [84])0x67bf07;
                  operator_delete(msg_21._M_dataplus._M_p,msg_21.field_2._M_allocated_capacity + 1);
                }
              }
              pUVar18 = &Args_5_02->MemorySize;
              if (Args_5_02->MemorySize % (ulong)*(uint *)*local_80 != 0) {
                in_R8 = "].pRanges[";
                in_R9 = (char (*) [45])&stack0xfffffffffffffedc;
                FormatString<char[41],char[15],unsigned_int,char[11],unsigned_int,char[15],unsigned_long,char[49],unsigned_int,char[2]>
                          (&msg_21,(Diligent *)"Bind sparse memory attribs are invalid: ",
                           (char (*) [41])"pTextureBinds[",(char (*) [15])&stack0xfffffffffffffed8,
                           (uint *)"].pRanges[",(char (*) [11])in_R9,(uint *)"].MemorySize (",
                           (char (*) [15])pUVar18,
                           (unsigned_long *)") must be a multiple of the texture block size (",
                           local_80,(uint *)0x920060,(char (*) [2])Args_9_01);
                Args_9_01 = (char (*) [84])0x67bf8b;
                DebugAssertionFailed
                          (msg_21._M_dataplus._M_p,"VerifyBindSparseResourceMemoryAttribs",
                           "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
                           ,0x514);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)msg_21._M_dataplus._M_p != paVar15) {
                  Args_9_01 = (char (*) [84])0x67bfa2;
                  operator_delete(msg_21._M_dataplus._M_p,msg_21.field_2._M_allocated_capacity + 1);
                }
              }
              if (local_74 != 6) {
                in_R8 = (char *)Args_5_02->MemorySize;
                uVar20 = Args_5_02->MipLevel;
                uVar9 = *(uint *)*local_88;
                if (((char (*) [23])in_R8 != (char (*) [23])0x0) && (uVar20 < uVar9)) {
                  uVar20 = *(uint *)*local_a8;
                  in_R9 = (char (*) [45])(ulong)uVar20;
                  uVar20 = ((~(Args_5_02->Region).MinY + (Args_5_02->Region).MaxY +
                            *(uint *)*local_a0) / *(uint *)*local_a0) *
                           ((~(Args_5_02->Region).MinX + (Args_5_02->Region).MaxX +
                            *(uint *)*local_98) / *(uint *)*local_98) *
                           ((~(Args_5_02->Region).MinZ + (Args_5_02->Region).MaxZ + uVar20) / uVar20
                           );
                  Capacity = CONCAT44(Capacity._4_4_,uVar20);
                  if ((ulong)*(uint *)*local_80 * (ulong)uVar20 - (long)in_R8 != 0) {
                    in_R8 = "].pRanges[";
                    in_R9 = (char (*) [45])&stack0xfffffffffffffedc;
                    FormatString<char[41],char[15],unsigned_int,char[11],unsigned_int,char[15],unsigned_long,char[50],unsigned_int,char[26]>
                              (&msg_21,(Diligent *)"Bind sparse memory attribs are invalid: ",
                               (char (*) [41])"pTextureBinds[",
                               (char (*) [15])&stack0xfffffffffffffed8,(uint *)"].pRanges[",
                               (char (*) [11])in_R9,(uint *)"].MemorySize (",(char (*) [15])pUVar18,
                               (unsigned_long *)") does not match the sparse memory blocks count (",
                               (char (*) [50])&Capacity,(uint *)") in the specified region",
                               (char (*) [26])Args_9_01);
                    Args_9_01 = (char (*) [84])0x67c0ba;
                    DebugAssertionFailed
                              (msg_21._M_dataplus._M_p,"VerifyBindSparseResourceMemoryAttribs",
                               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
                               ,0x51f);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)msg_21._M_dataplus._M_p != paVar15) {
                      Args_9_01 = (char (*) [84])0x67c0d1;
                      operator_delete(msg_21._M_dataplus._M_p,
                                      msg_21.field_2._M_allocated_capacity + 1);
                    }
                    uVar9 = *(uint *)*local_88;
                  }
                  uVar20 = Args_5_02->MipLevel;
                }
                if ((uVar20 == uVar9) && (*pUVar18 == 0)) {
                  in_R8 = "].pRanges[";
                  in_R9 = (char (*) [45])&stack0xfffffffffffffedc;
                  FormatString<char[41],char[15],unsigned_int,char[11],unsigned_int,char[30]>
                            (&msg_21,(Diligent *)"Bind sparse memory attribs are invalid: ",
                             (char (*) [41])"pTextureBinds[",(char (*) [15])&stack0xfffffffffffffed8
                             ,(uint *)"].pRanges[",(char (*) [11])in_R9,
                             (uint *)"].MemorySize must not be zero",(char (*) [30])Args_9_01);
                  Args_9_01 = (char (*) [84])0x67c137;
                  DebugAssertionFailed
                            (msg_21._M_dataplus._M_p,"VerifyBindSparseResourceMemoryAttribs",
                             "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
                             ,0x527);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)msg_21._M_dataplus._M_p != paVar15) {
                    Args_9_01 = (char (*) [84])0x67c14e;
                    operator_delete(msg_21._M_dataplus._M_p,msg_21.field_2._M_allocated_capacity + 1
                                   );
                  }
                }
                pIVar4 = Args_5_02->pMemory;
                if (pIVar4 != (IDeviceMemory *)0x0) {
                  Args_5_05 = (char (*) [43])0x67c16d;
                  iVar7 = (*(pIVar4->super_IDeviceObject).super_IObject._vptr_IObject[10])
                                    (pIVar4,local_48->pTexture);
                  if ((char)iVar7 == '\0') {
                    in_R8 = "].pRanges[";
                    in_R9 = (char (*) [45])&stack0xfffffffffffffedc;
                    FormatString<char[41],char[15],unsigned_int,char[11],unsigned_int,char[43]>
                              (&msg_21,(Diligent *)"Bind sparse memory attribs are invalid: ",
                               (char (*) [41])"pTextureBinds[",
                               (char (*) [15])&stack0xfffffffffffffed8,(uint *)"].pRanges[",
                               (char (*) [11])in_R9,
                               (uint *)"].pMemory must be compatible with pTexture",Args_5_05);
                    DebugAssertionFailed
                              (msg_21._M_dataplus._M_p,"VerifyBindSparseResourceMemoryAttribs",
                               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
                               ,0x52d);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)msg_21._M_dataplus._M_p != paVar15) {
                      operator_delete(msg_21._M_dataplus._M_p,
                                      msg_21.field_2._M_allocated_capacity + 1);
                    }
                  }
                  pacVar19 = (char (*) [2])0x67c1e1;
                  iVar7 = (*(Args_5_02->pMemory->super_IDeviceObject).super_IObject._vptr_IObject[9]
                          )();
                  Capacity = CONCAT44(extraout_var_07,iVar7);
                  if (Capacity < Args_5_02->MemorySize + Args_5_02->MemoryOffset) {
                    in_R8 = "].pRanges[";
                    in_R9 = (char (*) [45])&stack0xfffffffffffffedc;
                    FormatString<char[41],char[15],unsigned_int,char[11],unsigned_int,char[27],unsigned_long,char[19],unsigned_long,char[36],unsigned_long,char[2]>
                              (&msg_21,(Diligent *)"Bind sparse memory attribs are invalid: ",
                               (char (*) [41])"pTextureBinds[",
                               (char (*) [15])&stack0xfffffffffffffed8,(uint *)"].pRanges[",
                               (char (*) [11])in_R9,(uint *)"] specifies MemoryOffset (",
                               (char (*) [27])&Args_5_02->MemoryOffset,
                               (unsigned_long *)") and MemorySize (",(char (*) [19])pUVar18,
                               (unsigned_long *)") that exceed the memory capacity (",
                               (char (*) [36])&Capacity,(unsigned_long *)0x920060,pacVar19);
                    DebugAssertionFailed
                              (msg_21._M_dataplus._M_p,"VerifyBindSparseResourceMemoryAttribs",
                               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
                               ,0x532);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)msg_21._M_dataplus._M_p != paVar15) {
                      operator_delete(msg_21._M_dataplus._M_p,
                                      msg_21.field_2._M_allocated_capacity + 1);
                    }
                  }
                  Args_9_01 = (char (*) [84])0x67c28f;
                  iVar7 = (*(Args_5_02->pMemory->super_IDeviceObject).super_IObject._vptr_IObject[4]
                          )();
                  uVar10 = *(ulong *)(CONCAT44(extraout_var_08,iVar7) + 0x10);
                  if (uVar10 < Args_5_02->MemoryOffset % uVar10 + Args_5_02->MemorySize) {
                    in_R8 = "].pRanges[";
                    in_R9 = (char (*) [45])&stack0xfffffffffffffedc;
                    FormatString<char[41],char[15],unsigned_int,char[11],unsigned_int,char[27],unsigned_long,char[19],unsigned_long,char[84]>
                              (&msg_21,(Diligent *)"Bind sparse memory attribs are invalid: ",
                               (char (*) [41])"pTextureBinds[",
                               (char (*) [15])&stack0xfffffffffffffed8,(uint *)"].pRanges[",
                               (char (*) [11])in_R9,(uint *)"] specifies MemoryOffset (",
                               (char (*) [27])&Args_5_02->MemoryOffset,
                               (unsigned_long *)") and MemorySize (",(char (*) [19])pUVar18,
                               (unsigned_long *)
                               ") that don\'t fit into a single page. In Direct3D12 and Vulkan this will be an error"
                               ,Args_9_01);
                    Args_9_01 = (char (*) [84])0x67c308;
                    DebugAssertionFailed
                              (msg_21._M_dataplus._M_p,"VerifyBindSparseResourceMemoryAttribs",
                               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
                               ,0x539);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)msg_21._M_dataplus._M_p != paVar15) {
                      Args_9_01 = (char (*) [84])0x67c31f;
                      operator_delete(msg_21._M_dataplus._M_p,
                                      msg_21.field_2._M_allocated_capacity + 1);
                    }
                  }
                }
              }
              pSVar13 = local_48;
              if ((Args_5_02->pMemory == (IDeviceMemory *)0x0) && (Args_5_02->MemoryOffset != 0)) {
                in_R8 = "].pRanges[";
                in_R9 = (char (*) [45])&stack0xfffffffffffffedc;
                FormatString<char[41],char[15],unsigned_int,char[11],unsigned_int,char[49]>
                          (&msg_21,(Diligent *)"Bind sparse memory attribs are invalid: ",
                           (char (*) [41])"pTextureBinds[",(char (*) [15])&stack0xfffffffffffffed8,
                           (uint *)"].pRanges[",(char (*) [11])in_R9,
                           (uint *)"]: pMemory is null, but MemoryOffset is not zero",
                           (char (*) [49])Args_9_01);
                DebugAssertionFailed
                          (msg_21._M_dataplus._M_p,"VerifyBindSparseResourceMemoryAttribs",
                           "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
                           ,0x540);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)msg_21._M_dataplus._M_p != paVar15) {
                  operator_delete(msg_21._M_dataplus._M_p,msg_21.field_2._M_allocated_capacity + 1);
                }
              }
              uVar20 = uVar22 + 1;
            } while (uVar20 < pSVar13->NumRanges);
          }
        }
      }
      uVar20 = uVar21 + 1;
      in_RCX = local_70;
    } while (uVar20 < *(uint *)&local_70->pBufferBinds);
  }
  if (local_c8->NumWaitFences != 0) {
    if (local_c8->ppWaitFences == (IFence **)0x0) {
      FormatString<char[41],char[59]>
                (&msg,(Diligent *)"Bind sparse memory attribs are invalid: ",
                 (char (*) [41])"ppWaitFences must not be null if NumWaitFences is not zero",
                 (char (*) [59])in_RCX);
      in_RCX = (BindSparseResourceMemoryAttribs *)0x548;
      DebugAssertionFailed
                (msg._M_dataplus._M_p,"VerifyBindSparseResourceMemoryAttribs",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
                 ,0x548);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)msg._M_dataplus._M_p != &msg.field_2) {
        operator_delete(msg._M_dataplus._M_p,
                        CONCAT44(msg.field_2._M_allocated_capacity._4_4_,
                                 msg.field_2._M_allocated_capacity._0_4_) + 1);
      }
    }
    if (local_c8->pWaitFenceValues == (Uint64 *)0x0) {
      FormatString<char[41],char[63]>
                (&msg,(Diligent *)"Bind sparse memory attribs are invalid: ",
                 (char (*) [41])"pWaitFenceValues must not be null if NumWaitFences is not zero",
                 (char (*) [63])in_RCX);
      in_RCX = (BindSparseResourceMemoryAttribs *)0x549;
      DebugAssertionFailed
                (msg._M_dataplus._M_p,"VerifyBindSparseResourceMemoryAttribs",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
                 ,0x549);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)msg._M_dataplus._M_p != &msg.field_2) {
        operator_delete(msg._M_dataplus._M_p,
                        CONCAT44(msg.field_2._M_allocated_capacity._4_4_,
                                 msg.field_2._M_allocated_capacity._0_4_) + 1);
      }
      if (local_c8->pWaitFenceValues == (Uint64 *)0x0) goto LAB_0067c5bd;
    }
    msg_21._M_dataplus._M_p = msg_21._M_dataplus._M_p & 0xffffffff00000000;
    in_RCX = local_c8;
    if (local_c8->NumWaitFences != 0) {
      uVar20 = 0;
      do {
        pIVar14 = local_c8->ppWaitFences[uVar20];
        if (pIVar14 == (IFence *)0x0) {
          FormatString<char[41],char[14],unsigned_int,char[19]>
                    (&msg,(Diligent *)"Bind sparse memory attribs are invalid: ",
                     (char (*) [41])"ppWaitFences[",(char (*) [14])&msg_21,
                     (uint *)"] must not be null",(char (*) [19])in_R9);
          DebugAssertionFailed
                    (msg._M_dataplus._M_p,"VerifyBindSparseResourceMemoryAttribs",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
                     ,0x54f);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)msg._M_dataplus._M_p != &msg.field_2) {
            operator_delete(msg._M_dataplus._M_p,
                            CONCAT44(msg.field_2._M_allocated_capacity._4_4_,
                                     msg.field_2._M_allocated_capacity._0_4_) + 1);
          }
          pIVar14 = local_c8->ppWaitFences[(ulong)msg_21._M_dataplus._M_p & 0xffffffff];
        }
        iVar7 = (*(pIVar14->super_IDeviceObject).super_IObject._vptr_IObject[4])();
        if (*(char *)(CONCAT44(extraout_var_09,iVar7) + 8) != '\x01') {
          FormatString<char[41],char[14],unsigned_int,char[23]>
                    (&msg,(Diligent *)"Bind sparse memory attribs are invalid: ",
                     (char (*) [41])"ppWaitFences[",(char (*) [14])&msg_21,
                     (uint *)"] must be GENERAL type",(char (*) [23])in_R9);
          DebugAssertionFailed
                    (msg._M_dataplus._M_p,"VerifyBindSparseResourceMemoryAttribs",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
                     ,0x550);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)msg._M_dataplus._M_p != &msg.field_2) {
            operator_delete(msg._M_dataplus._M_p,
                            CONCAT44(msg.field_2._M_allocated_capacity._4_4_,
                                     msg.field_2._M_allocated_capacity._0_4_) + 1);
          }
        }
        uVar20 = (uint)msg_21._M_dataplus._M_p + 1;
        msg_21._M_dataplus._M_p._0_4_ = uVar20;
        in_RCX = local_c8;
      } while (uVar20 < local_c8->NumWaitFences);
    }
  }
LAB_0067c5bd:
  if (local_c8->NumSignalFences != 0) {
    if (local_c8->ppSignalFences == (IFence **)0x0) {
      FormatString<char[41],char[63]>
                (&msg,(Diligent *)"Bind sparse memory attribs are invalid: ",
                 (char (*) [41])"ppSignalFences must not be null if NumSignalFences is not zero",
                 (char (*) [63])in_RCX);
      in_RCX = (BindSparseResourceMemoryAttribs *)0x557;
      DebugAssertionFailed
                (msg._M_dataplus._M_p,"VerifyBindSparseResourceMemoryAttribs",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
                 ,0x557);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)msg._M_dataplus._M_p != &msg.field_2) {
        operator_delete(msg._M_dataplus._M_p,
                        CONCAT44(msg.field_2._M_allocated_capacity._4_4_,
                                 msg.field_2._M_allocated_capacity._0_4_) + 1);
      }
    }
    if (local_c8->pSignalFenceValues == (Uint64 *)0x0) {
      FormatString<char[41],char[67]>
                (&msg,(Diligent *)"Bind sparse memory attribs are invalid: ",
                 (char (*) [41])"pSignalFenceValues must not be null if NumSignalFences is not zero"
                 ,(char (*) [67])in_RCX);
      DebugAssertionFailed
                (msg._M_dataplus._M_p,"VerifyBindSparseResourceMemoryAttribs",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
                 ,0x558);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)msg._M_dataplus._M_p != &msg.field_2) {
        operator_delete(msg._M_dataplus._M_p,
                        CONCAT44(msg.field_2._M_allocated_capacity._4_4_,
                                 msg.field_2._M_allocated_capacity._0_4_) + 1);
      }
      if (local_c8->pSignalFenceValues == (Uint64 *)0x0) {
        return true;
      }
    }
    msg_21._M_dataplus._M_p = msg_21._M_dataplus._M_p & 0xffffffff00000000;
    if (local_c8->NumSignalFences != 0) {
      uVar20 = 0;
      do {
        pIVar14 = local_c8->ppSignalFences[uVar20];
        if (pIVar14 == (IFence *)0x0) {
          FormatString<char[41],char[16],unsigned_int,char[19]>
                    (&msg,(Diligent *)"Bind sparse memory attribs are invalid: ",
                     (char (*) [41])"ppSignalFences[",(char (*) [16])&msg_21,
                     (uint *)"] must not be null",(char (*) [19])in_R9);
          DebugAssertionFailed
                    (msg._M_dataplus._M_p,"VerifyBindSparseResourceMemoryAttribs",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
                     ,0x55e);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)msg._M_dataplus._M_p != &msg.field_2) {
            operator_delete(msg._M_dataplus._M_p,
                            CONCAT44(msg.field_2._M_allocated_capacity._4_4_,
                                     msg.field_2._M_allocated_capacity._0_4_) + 1);
          }
          pIVar14 = local_c8->ppSignalFences[(ulong)msg_21._M_dataplus._M_p & 0xffffffff];
        }
        iVar7 = (*(pIVar14->super_IDeviceObject).super_IObject._vptr_IObject[4])();
        if (*(char *)(CONCAT44(extraout_var_10,iVar7) + 8) != '\x01') {
          FormatString<char[41],char[16],unsigned_int,char[23]>
                    (&msg,(Diligent *)"Bind sparse memory attribs are invalid: ",
                     (char (*) [41])"ppSignalFences[",(char (*) [16])&msg_21,
                     (uint *)"] must be GENERAL type",(char (*) [23])in_R9);
          DebugAssertionFailed
                    (msg._M_dataplus._M_p,"VerifyBindSparseResourceMemoryAttribs",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
                     ,0x55f);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)msg._M_dataplus._M_p != &msg.field_2) {
            operator_delete(msg._M_dataplus._M_p,
                            CONCAT44(msg.field_2._M_allocated_capacity._4_4_,
                                     msg.field_2._M_allocated_capacity._0_4_) + 1);
          }
        }
        uVar20 = (uint)msg_21._M_dataplus._M_p + 1;
        msg_21._M_dataplus._M_p._0_4_ = uVar20;
      } while (uVar20 < local_c8->NumSignalFences);
    }
  }
  return true;
}

Assistant:

bool VerifyBindSparseResourceMemoryAttribs(const IRenderDevice* pDevice, const BindSparseResourceMemoryAttribs& Attribs)
{
#define CHECK_BIND_SPARSE_ATTRIBS(Expr, ...) CHECK_PARAMETER(Expr, "Bind sparse memory attribs are invalid: ", __VA_ARGS__)

    const SparseResourceProperties& SparseRes = pDevice->GetAdapterInfo().SparseResources;

    if (Attribs.NumBufferBinds != 0)
    {
        CHECK_BIND_SPARSE_ATTRIBS(Attribs.pBufferBinds != nullptr, "NumBufferBinds is ", Attribs.NumBufferBinds, ", but pBufferBinds is null");
        CHECK_BIND_SPARSE_ATTRIBS((SparseRes.CapFlags & SPARSE_RESOURCE_CAP_FLAG_BUFFER) != 0, "NumBufferBinds must be zero if SPARSE_RESOURCE_CAP_FLAG_BUFFER capability is not supported");
    }
    if (Attribs.NumTextureBinds != 0)
    {
        CHECK_BIND_SPARSE_ATTRIBS(Attribs.pTextureBinds != nullptr, "NumTextureBinds is ", Attribs.NumTextureBinds, ", but pTextureBinds is null");
        CHECK_BIND_SPARSE_ATTRIBS((SparseRes.CapFlags & SPARSE_RESOURCE_CAP_FLAG_TEXTURE_2D) != 0, "NumTextureBinds must be zero if SPARSE_RESOURCE_CAP_FLAG_TEXTURE_2D capability is not supported");
    }

    CHECK_BIND_SPARSE_ATTRIBS(Attribs.NumBufferBinds > 0 || Attribs.NumTextureBinds > 0, "One of NumBufferBinds and NumTextureBinds must not be zero");

#ifdef DILIGENT_DEVELOPMENT
    const bool IsMetal = pDevice->GetDeviceInfo().IsMetalDevice();

    for (Uint32 i = 0; i < Attribs.NumBufferBinds; ++i)
    {
        const SparseBufferMemoryBindInfo& Bind = Attribs.pBufferBinds[i];
        CHECK_BIND_SPARSE_ATTRIBS(Bind.pBuffer != nullptr, "pBufferBinds[", i, "].pBuffer must not be null");
        CHECK_BIND_SPARSE_ATTRIBS(Bind.NumRanges != 0, "pBufferBinds[", i, "].NumRanges must not be zero");
        CHECK_BIND_SPARSE_ATTRIBS(Bind.pRanges != nullptr, "pBufferBinds[", i, "].pRanges must not be null");

        if (Bind.pBuffer == nullptr)
            continue;

        const BufferDesc& Desc = Bind.pBuffer->GetDesc();
        CHECK_BIND_SPARSE_ATTRIBS(Desc.Usage == USAGE_SPARSE, "pBufferBinds[", i, "].pBuffer must be created with USAGE_SPARSE");

        if (Bind.pRanges == nullptr)
            continue;

        const SparseBufferProperties& BuffSparseProps = Bind.pBuffer->GetSparseProperties();
        for (Uint32 r = 0; r < Bind.NumRanges; ++r)
        {
            const SparseBufferMemoryBindRange& Range = Bind.pRanges[r];
            CHECK_BIND_SPARSE_ATTRIBS(Range.BufferOffset + Range.MemorySize <= Desc.Size,
                                      "pBufferBinds[", i, "].pRanges[", r, "] specifies a range with offset ", Range.BufferOffset, " and size ",
                                      Range.MemorySize, " that exceeds the buffer size (", Desc.Size, ")");
            CHECK_BIND_SPARSE_ATTRIBS(Range.BufferOffset % BuffSparseProps.BlockSize == 0,
                                      "pBufferBinds[", i, "].pRanges[", r, "].BufferOffset (", Range.BufferOffset,
                                      ") must be a multiple of the buffer block size (", BuffSparseProps.BlockSize, ")");

            CHECK_BIND_SPARSE_ATTRIBS(Range.MemorySize != 0,
                                      "pBufferBinds[", i, "].pRanges[", r, "].MemorySize must not be zero");
            CHECK_BIND_SPARSE_ATTRIBS(Range.MemorySize % BuffSparseProps.BlockSize == 0,
                                      "pBufferBinds[", i, "].pRanges[", r, "].MemorySize must be a multiple of the buffer block size (", BuffSparseProps.BlockSize, ")");

            if (Range.pMemory != nullptr)
            {
                CHECK_BIND_SPARSE_ATTRIBS(Range.pMemory->IsCompatible(Bind.pBuffer),
                                          "pBufferBinds[", i, "].pRanges[", r, "].pMemory must be compatible with pBuffer");

                const Uint64 Capacity = Range.pMemory->GetCapacity();
                CHECK_BIND_SPARSE_ATTRIBS(Range.MemoryOffset + Range.MemorySize <= Capacity,
                                          "pBufferBinds[", i, "].pRanges[", r, "] specifies a range with offset ", Range.MemoryOffset,
                                          " and size ", Range.MemorySize, " that exceeds the device memory size (", Capacity, ")");
                // Can not check here because final memory offset depends on the device memory object implementation
                //CHECK_BIND_SPARSE_ATTRIBS(Range.MemoryOffset % BuffSparseProps.BlockSize == 0)

                const Uint64 PageSize = Range.pMemory->GetDesc().PageSize;
                CHECK_BIND_SPARSE_ATTRIBS((Range.MemoryOffset % PageSize) + Range.MemorySize <= PageSize,
                                          "pBufferBinds[", i, "].pRanges[", r, "] specifies a range with offset ", Range.MemoryOffset,
                                          " and size ", Range.MemorySize,
                                          " that does not fit into a single page. in Direct3D12 and Vulkan this will be an error");
            }
            else
            {
                CHECK_BIND_SPARSE_ATTRIBS(Range.MemoryOffset == 0,
                                          "pBufferBinds[", i, "].pRanges[", r, "]: if pMemory is null, but MemoryOffset is not zero");
            }
        }
    }

    for (Uint32 i = 0; i < Attribs.NumTextureBinds; ++i)
    {
        const SparseTextureMemoryBindInfo& Bind = Attribs.pTextureBinds[i];
        CHECK_BIND_SPARSE_ATTRIBS(Bind.pTexture != nullptr, "pTextureBinds[", i, "].pTexture must not be null");
        CHECK_BIND_SPARSE_ATTRIBS(Bind.NumRanges != 0, "pTextureBinds[", i, "].NumRanges must not be zero");
        CHECK_BIND_SPARSE_ATTRIBS(Bind.pRanges != nullptr, "pTextureBinds[", i, "].pRanges must not be null");

        if (Bind.pTexture == nullptr)
            continue;

        const TextureDesc& Desc = Bind.pTexture->GetDesc();
        CHECK_BIND_SPARSE_ATTRIBS(Desc.Usage == USAGE_SPARSE, "pTextureBinds[", i, "].pTexture must be created with USAGE_SPARSE");

        if (Bind.pRanges == nullptr)
            continue;

        const SparseTextureProperties& TexSparseProps = Bind.pTexture->GetSparseProperties();
        for (Uint32 r = 0; r < Bind.NumRanges; ++r)
        {
            const SparseTextureMemoryBindRange& Range     = Bind.pRanges[r];
            const Box&                          Region    = Range.Region;
            const MipLevelProperties            MipProps  = GetMipLevelProperties(Desc, Range.MipLevel);
            const Uint32                        MipWidth  = MipProps.StorageWidth;
            const Uint32                        MipHeight = MipProps.StorageHeight;
            const Uint32                        MipDepth  = MipProps.Depth;

            CHECK_BIND_SPARSE_ATTRIBS(Range.MipLevel < Desc.MipLevels,
                                      "pTextureBinds[", i, "].pRanges[", r, "].MipLevel (", Range.MipLevel,
                                      ") must be less than the mip level count (", Desc.MipLevels, ").");
            CHECK_BIND_SPARSE_ATTRIBS(Range.MipLevel <= TexSparseProps.FirstMipInTail,
                                      "pTextureBinds[", i, "].pRanges[", r, "].MipLevel (", Range.MipLevel,
                                      ") must not exceed the first mip in tail (", TexSparseProps.FirstMipInTail, ")");

            if (Range.MipLevel < TexSparseProps.FirstMipInTail)
            {
                CHECK_BIND_SPARSE_ATTRIBS(Range.OffsetInMipTail == 0,
                                          "pTextureBinds[", i, "].pRanges[", r, "].OffsetInMipTail must be zero when Range.MipLevel is not a tail mip");
                CHECK_BIND_SPARSE_ATTRIBS(Region.IsValid(),
                                          "pTextureBinds[", i, "].pRanges[", r, "].Region must be valid");
                CHECK_BIND_SPARSE_ATTRIBS(Region.MaxX <= MipWidth || Region.MaxX == AlignUp(MipWidth, TexSparseProps.TileSize[0]),
                                          "pTextureBinds[", i, "].pRanges[", r, "].Region.MaxX (", Region.MaxX, ") must not exceed the mip level width (", MipWidth, ")");
                CHECK_BIND_SPARSE_ATTRIBS(Region.MaxY <= MipHeight || Region.MaxY == AlignUp(MipHeight, TexSparseProps.TileSize[1]),
                                          "pTextureBinds[", i, "].pRanges[", r, "].Region.MaxY (", Region.MaxY, ") must not exceed the mip level height (", MipHeight, ")");
                CHECK_BIND_SPARSE_ATTRIBS(Region.MaxZ <= MipDepth || Region.MaxZ == AlignUp(MipDepth, TexSparseProps.TileSize[2]),
                                          "pTextureBinds[", i, "].pRanges[", r, "].Region.MaxZ (", Region.MaxZ, ") must not exceed the mip level depth (", MipDepth, ")");

                CHECK_BIND_SPARSE_ATTRIBS((Region.MinX % TexSparseProps.TileSize[0]) == 0,
                                          "pTextureBinds[", i, "].pRanges[", r, "].Region.MinX (", Region.MinX, ") must be a multiple of the tile width (", TexSparseProps.TileSize[0], ")");
                CHECK_BIND_SPARSE_ATTRIBS((Region.MinY % TexSparseProps.TileSize[1]) == 0,
                                          "pTextureBinds[", i, "].pRanges[", r, "].Region.MinY (", Region.MinY, ") must be a multiple of the tile height (", TexSparseProps.TileSize[1], ")");
                CHECK_BIND_SPARSE_ATTRIBS((Region.MinZ % TexSparseProps.TileSize[2]) == 0,
                                          "pTextureBinds[", i, "].pRanges[", r, "].Region.MinZ (", Region.MinZ, ") must be a multiple of the tile depth (", TexSparseProps.TileSize[2], ")");
                CHECK_BIND_SPARSE_ATTRIBS((Region.Width() % TexSparseProps.TileSize[0]) == 0 || Region.MaxX == MipWidth,
                                          "pTextureBinds[", i, "].pRanges[", r, "].Region width (", Region.Width(), ") must be a multiple of the tile width (", TexSparseProps.TileSize[0], ")");
                CHECK_BIND_SPARSE_ATTRIBS((Region.Height() % TexSparseProps.TileSize[1]) == 0 || Region.MaxY == MipHeight,
                                          "pTextureBinds[", i, "].pRanges[", r, "].Region height (", Region.Height(), ") must be multiple of the tile height (", TexSparseProps.TileSize[1], ")");
                CHECK_BIND_SPARSE_ATTRIBS((Region.Depth() % TexSparseProps.TileSize[2]) == 0 || Region.MaxZ == MipDepth,
                                          "pTextureBinds[", i, "].pRanges[", r, "].Region depth (", Region.Depth(), ") must be a multiple of the tile depth (", TexSparseProps.TileSize[2], ")");
            }
            else
            {
                CHECK_BIND_SPARSE_ATTRIBS(Region == Box{},
                                          "pTextureBinds[", i, "].pRanges[", r, "].Region must be default when Range.MipLevel is a tail mip");
                CHECK_BIND_SPARSE_ATTRIBS(Range.OffsetInMipTail + Range.MemorySize <= TexSparseProps.MipTailSize,
                                          "pTextureBinds[", i, "].pRanges[", r, "] specifies OffsetInMipTail (", Range.OffsetInMipTail,
                                          ") and MemorySize (", Range.MemorySize, ") that exceed the mip tail size (", TexSparseProps.MipTailSize, ")");
                CHECK_BIND_SPARSE_ATTRIBS(Range.OffsetInMipTail % TexSparseProps.BlockSize == 0,
                                          "pTextureBinds[", i, "].pRanges[", r, "].OffsetInMipTail (", Range.OffsetInMipTail,
                                          ") must be a multiple of the texture block size (", TexSparseProps.BlockSize, ")");

                if (TexSparseProps.Flags & SPARSE_TEXTURE_FLAG_SINGLE_MIPTAIL)
                {
                    CHECK_BIND_SPARSE_ATTRIBS(Range.ArraySlice == 0,
                                              "pTextureBinds[", i, "].pRanges[", r, "].ArraySlice (", Range.ArraySlice, ") must be 0 for a single mip tail");
                }

                if (IsMetal)
                {
                    CHECK_BIND_SPARSE_ATTRIBS(Range.OffsetInMipTail == 0 && (Range.MemorySize == 0 || Range.MemorySize == TexSparseProps.MipTailSize),
                                              "pTextureBinds[", i, "].pRanges[", r, "]: in Metal, mip tail must be bound in a single memory range: ",
                                              "OffsetInMipTail (", Range.OffsetInMipTail, ") must be zero and MemorySize (", Range.MemorySize,
                                              ") must be equal to the mip tail size (", TexSparseProps.MipTailSize, ") or zero");
                }
            }

            CHECK_BIND_SPARSE_ATTRIBS(Range.ArraySlice < Desc.GetArraySize(),
                                      "pTextureBinds[", i, "].pRanges[", r, "].ArraySlice (", Range.ArraySlice, ") must be less than the array size (", Desc.GetArraySize(), ")");

            // MemorySize can be zero
            CHECK_BIND_SPARSE_ATTRIBS(Range.MemorySize % TexSparseProps.BlockSize == 0,
                                      "pTextureBinds[", i, "].pRanges[", r, "].MemorySize (", Range.MemorySize,
                                      ") must be a multiple of the texture block size (", TexSparseProps.BlockSize, ")");

            // In Metal, MemorySize is not defined and not used
            if (!IsMetal)
            {
                if (Range.MemorySize != 0 && Range.MipLevel < TexSparseProps.FirstMipInTail)
                {
                    const uint3  TilesInBox = GetNumSparseTilesInBox(Region, TexSparseProps.TileSize);
                    const Uint32 NumBlocks  = TilesInBox.x * TilesInBox.y * TilesInBox.z;
                    CHECK_BIND_SPARSE_ATTRIBS(Uint64{NumBlocks} * Uint64{TexSparseProps.BlockSize} == Range.MemorySize,
                                              "pTextureBinds[", i, "].pRanges[", r, "].MemorySize (", Range.MemorySize, ") does not match the sparse memory blocks count (",
                                              NumBlocks, ") in the specified region");
                }

                // packed mip tail
                if (Range.MipLevel == TexSparseProps.FirstMipInTail)
                {
                    // MemorySize is used to specify how much block must be bound/unbound
                    CHECK_BIND_SPARSE_ATTRIBS(Range.MemorySize != 0,
                                              "pTextureBinds[", i, "].pRanges[", r, "].MemorySize must not be zero");
                }

                if (Range.pMemory != nullptr)
                {
                    CHECK_BIND_SPARSE_ATTRIBS(Range.pMemory->IsCompatible(Bind.pTexture),
                                              "pTextureBinds[", i, "].pRanges[", r, "].pMemory must be compatible with pTexture");

                    const Uint64 Capacity = Range.pMemory->GetCapacity();
                    CHECK_BIND_SPARSE_ATTRIBS(Range.MemoryOffset + Range.MemorySize <= Capacity,
                                              "pTextureBinds[", i, "].pRanges[", r, "] specifies MemoryOffset (", Range.MemoryOffset, ") and MemorySize (",
                                              Range.MemorySize, ") that exceed the memory capacity (", Capacity, ")");
                    // Can not check here because the final memory offset depends on the device memory object implementation
                    //CHECK_BIND_SPARSE_ATTRIBS(Range.MemoryOffset % BuffSparseProps.BlockSize == 0)

                    const Uint64 PageSize = Range.pMemory->GetDesc().PageSize;
                    CHECK_BIND_SPARSE_ATTRIBS((Range.MemoryOffset % PageSize) + Range.MemorySize <= PageSize,
                                              "pTextureBinds[", i, "].pRanges[", r, "] specifies MemoryOffset (", Range.MemoryOffset, ") and MemorySize (", Range.MemorySize,
                                              ") that don't fit into a single page. In Direct3D12 and Vulkan this will be an error");
                }
            }

            if (Range.pMemory == nullptr)
            {
                CHECK_BIND_SPARSE_ATTRIBS(Range.MemoryOffset == 0,
                                          "pTextureBinds[", i, "].pRanges[", r, "]: pMemory is null, but MemoryOffset is not zero");
            }
        }
    }
#endif // DILIGENT_DEVELOPMENT

    if (Attribs.NumWaitFences != 0)
    {
        CHECK_BIND_SPARSE_ATTRIBS(Attribs.ppWaitFences != nullptr, "ppWaitFences must not be null if NumWaitFences is not zero");
        CHECK_BIND_SPARSE_ATTRIBS(Attribs.pWaitFenceValues != nullptr, "pWaitFenceValues must not be null if NumWaitFences is not zero");

        if (Attribs.pWaitFenceValues != nullptr)
        {
            for (Uint32 i = 0; i < Attribs.NumWaitFences; ++i)
            {
                CHECK_BIND_SPARSE_ATTRIBS(Attribs.ppWaitFences[i] != nullptr, "ppWaitFences[", i, "] must not be null");
                CHECK_BIND_SPARSE_ATTRIBS(Attribs.ppWaitFences[i]->GetDesc().Type == FENCE_TYPE_GENERAL, "ppWaitFences[", i, "] must be GENERAL type");
            }
        }
    }

    if (Attribs.NumSignalFences != 0)
    {
        CHECK_BIND_SPARSE_ATTRIBS(Attribs.ppSignalFences != nullptr, "ppSignalFences must not be null if NumSignalFences is not zero");
        CHECK_BIND_SPARSE_ATTRIBS(Attribs.pSignalFenceValues != nullptr, "pSignalFenceValues must not be null if NumSignalFences is not zero");

        if (Attribs.pSignalFenceValues != nullptr)
        {
            for (Uint32 i = 0; i < Attribs.NumSignalFences; ++i)
            {
                CHECK_BIND_SPARSE_ATTRIBS(Attribs.ppSignalFences[i] != nullptr, "ppSignalFences[", i, "] must not be null");
                CHECK_BIND_SPARSE_ATTRIBS(Attribs.ppSignalFences[i]->GetDesc().Type == FENCE_TYPE_GENERAL, "ppSignalFences[", i, "] must be GENERAL type");
            }
        }
    }

#undef CHECK_BIND_SPARSE_ATTRIBS

    return true;
}